

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

void __thiscall QMessageBox::setStandardButtons(QMessageBox *this,StandardButtons buttons)

{
  bool bVar1;
  Int value;
  QMessageBoxPrivate *this_00;
  QDialogButtonBox *in_RDI;
  long in_FS_OFFSET;
  QMessageBoxPrivate *d;
  QList<QAbstractButton_*> buttonList;
  QDialogButtonBox *this_01;
  QMessageBoxPrivate *in_stack_ffffffffffffffe8;
  QFlags local_c [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QMessageBox *)0x7a49a9);
  this_01 = this_00->buttonBox;
  value = ::QFlags::operator_cast_to_int(local_c);
  QFlag::QFlag((QFlag *)&stack0xffffffffffffffec,value);
  QFlags<QDialogButtonBox::StandardButton>::QFlagsStorageHelper
            ((QFlags<QDialogButtonBox::StandardButton> *)this_01,
             (QFlag)(int)((ulong)this_00 >> 0x20));
  QDialogButtonBox::setStandardButtons
            ((QDialogButtonBox *)this_00,
             (QFlagsStorageHelper<QDialogButtonBox::StandardButton,_4>)
             SUB84((ulong)in_RDI >> 0x20,0));
  QDialogButtonBox::buttons(in_RDI);
  bVar1 = QListSpecialMethodsBase<QAbstractButton*>::contains<QAbstractButton*>
                    ((QListSpecialMethodsBase<QAbstractButton_*> *)this_00,
                     (QAbstractButton **)this_01);
  if (!bVar1) {
    this_00->escapeButton = (QAbstractButton *)0x0;
  }
  bVar1 = QListSpecialMethodsBase<QAbstractButton*>::contains<QPushButton*>
                    ((QListSpecialMethodsBase<QAbstractButton_*> *)this_00,(QPushButton **)this_01);
  if (!bVar1) {
    this_00->defaultButton = (QPushButton *)0x0;
  }
  this_00->autoAddOkButton = false;
  QMessageBoxPrivate::updateSize(in_stack_ffffffffffffffe8);
  QList<QAbstractButton_*>::~QList((QList<QAbstractButton_*> *)0x7a4a9d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageBox::setStandardButtons(StandardButtons buttons)
{
    Q_D(QMessageBox);
    d->buttonBox->setStandardButtons(QDialogButtonBox::StandardButtons(int(buttons)));

    QList<QAbstractButton *> buttonList = d->buttonBox->buttons();
    if (!buttonList.contains(d->escapeButton))
        d->escapeButton = nullptr;
    if (!buttonList.contains(d->defaultButton))
        d->defaultButton = nullptr;
    d->autoAddOkButton = false;
    d->updateSize();
}